

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Bmc_MnaCollect(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,uint *pState)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  vNodes->nSize = 0;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x8000000000000000;
  p->pObjs->Value = 1;
  if (0 < vCos->nSize) {
    lVar5 = 0;
    do {
      iVar2 = vCos->pArray[lVar5];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar2;
      if ((-1 < (int)(uint)*(undefined8 *)pGVar1) ||
         (uVar3 = (uint)*(undefined8 *)pGVar1 & 0x1fffffff, uVar3 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcAnd.c"
                      ,0xa9,
                      "void Bmc_MnaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, unsigned int *)");
      }
      Bmc_MnaCollect_rec(p,pGVar1 + -(ulong)uVar3,vNodes,pState);
      uVar3 = pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value;
      uVar4 = ((((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) != 0) + 1 != uVar3) + 1;
      if (uVar3 == 3) {
        uVar4 = 3;
      }
      pGVar1->Value = uVar4;
      if (uVar3 != 3) {
        __assert_fail("pObj->Value == GIA_UND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcAnd.c"
                      ,0xac,
                      "void Bmc_MnaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, unsigned int *)");
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCos->nSize);
  }
  return;
}

Assistant:

void Bmc_MnaCollect( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, unsigned * pState )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vNodes );
    Gia_ManConst0(p)->fPhase = 1;
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        Bmc_MnaCollect_rec( p, Gia_ObjFanin0(pObj), vNodes, pState );
        pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        assert( pObj->Value == GIA_UND );
    }
}